

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

int match_lit(char **str,size_t *len,char *lit,size_t litlen,date_parse_string *capture)

{
  char *p;
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  ulong uVar4;
  size_t sVar5;
  char *__s2;
  size_t matchlen;
  ulong local_38;
  
  if (lit == (char *)0x0) {
LAB_00253132:
    iVar1 = 0;
  }
  else {
    if ((litlen == 0) || (*lit != '^')) {
      iVar1 = t3_compare_case_fold(lit,litlen,*str,*len,&local_38);
      if (iVar1 != 0) goto LAB_00253132;
      __s2 = *str;
      uVar4 = *len;
    }
    else {
      litlen = litlen - 1;
      uVar4 = *len;
      if (uVar4 < litlen) {
        return 0;
      }
      __s2 = *str;
      iVar1 = bcmp(lit + 1,__s2,litlen);
      local_38 = litlen;
      if (iVar1 != 0) {
        return 0;
      }
    }
    p = __s2 + local_38;
    sVar5 = uVar4 - local_38;
    if (litlen != 0 && sVar5 != 0) {
      wVar2 = utf8_ptr::s_getch_before(p,1);
      wVar3 = utf8_ptr::s_getch(p);
      iVar1 = isalpha(wVar2);
      if (((iVar1 != 0) && (iVar1 = isalpha(wVar3), iVar1 != 0)) ||
         ((uint)(wVar2 + L'\xffffffd0') < 10 && (uint)(wVar3 + L'\xffffffd0') < 10))
      goto LAB_00253132;
      __s2 = *str;
    }
    capture->p = __s2;
    capture->len = (long)p - (long)*str;
    *str = p;
    *len = sVar5;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int match_lit(const char *&str, size_t &len,
                     const char *lit, size_t litlen,
                     date_parse_string &capture)
{
    /* if there's no literal, there's no match */
    if (lit == 0)
        return 0;

    /* if the template starts with "^", it means do not fold case */
    int fold_case = TRUE;
    if (litlen != 0 && *lit == '^')
        fold_case = FALSE, ++lit, --litlen;

    /* try matching the template text */
    size_t matchlen;
    if (fold_case)
    {
        /* compare the leading substring of 'str' with case folding */
        if (t3_compare_case_fold(lit, litlen, str, len, &matchlen) != 0)
            return FALSE;
    }
    else if (len >= litlen)
    {
        /* compare exactly as given with no case folding */
        if (memcmp(lit, str, litlen) != 0)
            return FALSE;
        matchlen = litlen;
    }
    else
    {
        /* it's too short to match */
        return FALSE;
    }

    /* get a pointer to the next character after the end of the match */
    utf8_ptr p((char *)str + matchlen);
    size_t rem = len - matchlen;

    /* make sure we ended on a suitable boundary */
    if (rem != 0 && litlen != 0)
    {
        /* get the last character of the matched text */
        wchar_t last = p.getch_before(1);
        wchar_t next = p.getch();

        /* if we ended on alphabetic, make sure the next is non-alpha */
        if (isalpha(last) && isalpha(next))
            return FALSE;

        /* if we ended on a number, maek sure the next is non-numeric */
        if (isdigit(last) && isdigit(next))
            return FALSE;
    }
    
    /* set the capture data */
    capture.p = str;
    capture.len = p.getptr() - str;

    /* advance the caller's string pointers past the match */
    str = p.getptr();
    len = rem;

    /* return success */
    return TRUE;
}